

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

Bounds2f __thiscall
pbrt::RealisticCamera::BoundExitPupil(RealisticCamera *this,Float filmX0,Float filmX1)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  Float FVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  Tuple2<pbrt::Point2,_float> TVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined4 in_XMM10_Da;
  undefined1 in_register_00001484 [12];
  Bounds2f BVar21;
  string ret;
  Float local_e8;
  Float local_e4;
  undefined1 local_e0 [32];
  MediumHandle local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_a8._8_4_ = 0x7f7fffff;
  local_a8._0_8_ = 0x7f7fffff7f7fffff;
  local_a8._12_4_ = 0x7f7fffff;
  local_b8._8_4_ = 0xff7fffff;
  local_b8._0_8_ = 0xff7fffffff7fffff;
  local_b8._12_4_ = 0xff7fffff;
  uVar7 = 0;
  iVar5 = 0;
  fVar1 = (this->elementInterfaces).ptr[(this->elementInterfaces).nStored - 1].apertureRadius;
  auVar11 = ZEXT416((uint)(fVar1 * 1.5));
  auVar15 = ZEXT416((uint)(fVar1 * -1.5));
  local_68 = vminss_avx(auVar11,auVar15);
  local_78 = vmaxss_avx(auVar11,auVar15);
  local_88 = local_68._0_4_;
  local_98 = local_78._0_4_;
  local_e8 = filmX1;
  local_e4 = filmX0;
  fStack_94 = local_98;
  fStack_90 = local_98;
  fStack_8c = local_98;
  fStack_84 = local_88;
  fStack_80 = local_88;
  fStack_7c = local_88;
  do {
    auVar11 = ZEXT816(0) << 0x40;
    auVar15 = ZEXT816(0) << 0x40;
    fVar1 = ((float)(int)uVar7 + 0.5) * 9.536743e-07;
    if (uVar7 != 0) {
      lVar6 = 0;
      fVar13 = 1.0;
      uVar4 = uVar7;
      do {
        fVar13 = fVar13 * 0.5;
        lVar6 = (lVar6 - uVar4 / 2) * 2 + uVar4;
        bVar8 = 1 < uVar4;
        uVar4 = uVar4 / 2;
      } while (bVar8);
      auVar11._4_12_ = in_register_00001484;
      auVar11._0_4_ = in_XMM10_Da;
      auVar11 = vcvtusi2ss_avx512f(auVar11,lVar6);
      lVar6 = 0;
      fVar18 = 1.0;
      uVar4 = uVar7;
      do {
        fVar18 = fVar18 * 0.33333334;
        lVar6 = (lVar6 - uVar4 / 3) * 3 + uVar4;
        bVar8 = 2 < uVar4;
        uVar4 = uVar4 / 3;
      } while (bVar8);
      auVar15._4_12_ = in_register_00001484;
      auVar15._0_4_ = in_XMM10_Da;
      auVar15 = vcvtusi2ss_avx512f(auVar15,lVar6);
      auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(fVar13 * auVar11._0_4_)));
      auVar15 = ZEXT416((uint)(fVar18 * auVar15._0_4_));
    }
    auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar15);
    auVar11 = vinsertps_avx(auVar11,auVar15,0x10);
    auVar19._8_4_ = 0x3f800000;
    auVar19._0_8_ = 0x3f8000003f800000;
    auVar19._12_4_ = 0x3f800000;
    auVar20._0_4_ = auVar11._0_4_ * local_98;
    auVar20._4_4_ = auVar11._4_4_ * fStack_94;
    auVar20._8_4_ = auVar11._8_4_ * fStack_90;
    auVar20._12_4_ = auVar11._12_4_ * fStack_8c;
    auVar11 = vsubps_avx(auVar19,auVar11);
    auVar2._4_4_ = fStack_84;
    auVar2._0_4_ = local_88;
    auVar2._8_4_ = fStack_80;
    auVar2._12_4_ = fStack_7c;
    auVar15 = vfmadd231ps_fma(auVar20,auVar11,auVar2);
    uVar4 = vcmpps_avx512vl(local_a8,auVar15,6);
    auVar11 = vmovshdup_avx(auVar15);
    if (((((uVar4 & 1) != 0) || (local_b8._0_4_ < auVar15._0_4_)) || ((uVar4 >> 1 & 1) != 0)) ||
       (auVar2 = vmovshdup_avx(local_b8), auVar2._0_4_ < auVar11._0_4_)) {
      auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * filmX1)),ZEXT416((uint)(1.0 - fVar1)),
                               ZEXT416((uint)filmX0));
      local_e0._0_4_ = auVar2._0_4_;
      auVar2 = vblendps_avx(ZEXT416((uint)(auVar15._0_4_ - (float)local_e0._0_4_)),auVar15,2);
      auVar2 = vmovlhps_avx(ZEXT816(0) << 0x20,auVar2);
      local_e0._4_4_ = auVar2._0_4_;
      local_e0._8_8_ = auVar2._4_8_;
      local_e0._16_4_ = auVar2._12_4_;
      local_e0._24_4_ = 0.0;
      local_c0.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
               )0;
      local_e0._20_4_ =
           (this->elementInterfaces).ptr[(this->elementInterfaces).nStored - 1].thickness;
      local_58 = auVar11;
      local_48 = auVar15;
      FVar10 = TraceLensesFromFilm(this,(Ray *)local_e0,(Ray *)0x0);
      if ((FVar10 != 0.0) || (NAN(FVar10))) {
        auVar2 = vmovshdup_avx(local_b8);
        auVar11 = local_58;
        auVar15 = local_48;
        goto LAB_00420715;
      }
    }
    else {
LAB_00420715:
      uVar3 = vcmpss_avx512f(local_b8,auVar15,1);
      bVar8 = (bool)((byte)uVar3 & 1);
      local_a8 = vminps_avx(auVar15,local_a8);
      iVar5 = iVar5 + 1;
      auVar9._4_12_ = local_b8._4_12_;
      auVar9._0_4_ = (uint)bVar8 * auVar15._0_4_ + (uint)!bVar8 * local_b8._0_4_;
      auVar11 = vmaxss_avx(auVar11,auVar2);
      local_b8 = vinsertps_avx(auVar9,auVar11,0x10);
    }
    uVar7 = uVar7 + 1;
    if (uVar7 == 0x100000) {
      if (iVar5 == 0) {
        local_a8._4_4_ = local_88;
        local_a8._0_4_ = local_88;
        auVar12._8_4_ = local_88;
        auVar12._0_4_ = local_88;
        auVar12._4_4_ = local_88;
        auVar12._12_4_ = local_88;
        local_b8._4_4_ = local_98;
        local_b8._0_4_ = local_98;
        auVar17._8_4_ = local_98;
        auVar17._0_4_ = local_98;
        auVar17._4_4_ = local_98;
        auVar17._12_4_ = local_98;
        if (LOGGING_LogLevel < 1) {
          local_e0._8_8_ = 0;
          local_e0._16_4_ = local_e0._16_4_ & 0xffffff00;
          local_b8 = auVar17;
          local_a8 = auVar12;
          local_e0._0_8_ = local_e0 + 0x10;
          detail::stringPrintfRecursive<float&,float&>
                    ((string *)local_e0,"Unable to find exit pupil in x = [%f,%f] on film.",
                     &local_e4,&local_e8);
          Log(Verbose,
              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cameras.cpp"
              ,900,(char *)local_e0._0_8_);
          if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
            operator_delete((void *)local_e0._0_8_,CONCAT44(local_e0._20_4_,local_e0._16_4_) + 1);
          }
        }
      }
      else {
        fVar1 = ((float)local_78._0_4_ - (float)local_68._0_4_) *
                ((float)local_78._0_4_ - (float)local_68._0_4_);
        auVar11 = ZEXT416((uint)(fVar1 + fVar1));
        auVar11 = vsqrtss_avx(auVar11,auVar11);
        fVar1 = (auVar11._0_4_ + auVar11._0_4_) * 0.0009765625;
        auVar16._4_4_ = fVar1;
        auVar16._0_4_ = fVar1;
        auVar16._8_4_ = fVar1;
        auVar16._12_4_ = fVar1;
        auVar11 = vsubps_avx(local_a8,auVar16);
        local_a8._0_8_ = auVar11._0_8_;
        TVar14.x = fVar1 + local_b8._0_4_;
        TVar14.y = fVar1 + local_b8._4_4_;
        local_b8._0_8_ = TVar14;
      }
      BVar21.pMax.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)local_b8._0_8_;
      BVar21.pMin.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)local_a8._0_8_;
      return BVar21;
    }
  } while( true );
}

Assistant:

Bounds2f RealisticCamera::BoundExitPupil(Float filmX0, Float filmX1) const {
    Bounds2f pupilBounds;
    // Sample a collection of points on the rear lens to find exit pupil
    const int nSamples = 1024 * 1024;
    int nExitingRays = 0;
    // Compute bounding box of projection of rear element on sampling plane
    Float rearRadius = RearElementRadius();
    Bounds2f projRearBounds(Point2f(-1.5f * rearRadius, -1.5f * rearRadius),
                            Point2f(1.5f * rearRadius, 1.5f * rearRadius));

    for (int i = 0; i < nSamples; ++i) {
        // Find location of sample points on $x$ segment and rear lens element
        Point3f pFilm(Lerp((i + 0.5f) / nSamples, filmX0, filmX1), 0, 0);
        Float u[2] = {RadicalInverse(0, i), RadicalInverse(1, i)};
        Point3f pRear(Lerp(u[0], projRearBounds.pMin.x, projRearBounds.pMax.x),
                      Lerp(u[1], projRearBounds.pMin.y, projRearBounds.pMax.y),
                      LensRearZ());

        // Expand pupil bounds if ray makes it through the lens system
        if (Inside(Point2f(pRear.x, pRear.y), pupilBounds) ||
            TraceLensesFromFilm(Ray(pFilm, pRear - pFilm), nullptr)) {
            pupilBounds = Union(pupilBounds, Point2f(pRear.x, pRear.y));
            ++nExitingRays;
        }
    }

    // Return entire element bounds if no rays made it through the lens system
    if (nExitingRays == 0) {
        LOG_VERBOSE("Unable to find exit pupil in x = [%f,%f] on film.", filmX0, filmX1);
        return projRearBounds;
    }

    // Expand bounds to account for sample spacing
    pupilBounds =
        Expand(pupilBounds, 2 * Length(projRearBounds.Diagonal()) / std::sqrt(nSamples));

    return pupilBounds;
}